

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O1

void __thiscall VersionsList::Read(VersionsList *this,istream *stream)

{
  char cVar1;
  istream *piVar2;
  string line;
  value_type local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_40,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->versions_,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Read(std::istream& stream) {
		std::string line;
		while (std::getline(stream, line)) {
			versions_.push_back(line);
		}
	}